

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

void __thiscall
nlohmann::
basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
::dump(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
       *this,ostream *o,bool pretty_print,uint indent_step,uint current_indent)

{
  ostream *poVar1;
  object_t *poVar2;
  _Base_ptr p_Var3;
  long *plVar4;
  size_t sVar5;
  array_t *paVar6;
  size_type *psVar7;
  ulong uVar8;
  char cVar9;
  char *pcVar10;
  _Alloc_hider _Var11;
  pointer this_00;
  uint uVar12;
  undefined1 local_a8 [24];
  long lStack_90;
  char local_88 [32];
  string_t local_68;
  char *local_48;
  char *local_40;
  long local_38;
  
  if (discarded < this->m_type) {
    return;
  }
  uVar12 = (uint)pretty_print;
  switch(this->m_type) {
  case null:
    pcVar10 = "null";
    uVar8 = 4;
    break;
  case object:
    if ((((this->m_value).object)->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(o,"{",1);
      if (pretty_print) {
        current_indent = current_indent + indent_step;
        std::__ostream_insert<char,std::char_traits<char>>(o,"\n",1);
      }
      poVar2 = (this->m_value).object;
      p_Var3 = (poVar2->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      if ((_Rb_tree_header *)p_Var3 != &(poVar2->_M_t)._M_impl.super__Rb_tree_header) {
        local_48 = ",";
        if (pretty_print) {
          local_48 = ",\n";
        }
        local_38 = (ulong)uVar12 + 1;
        local_40 = "";
        if (pretty_print) {
          local_40 = " ";
        }
        do {
          if (p_Var3 != (poVar2->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left) {
            std::__ostream_insert<char,std::char_traits<char>>(o,local_48,local_38);
          }
          local_a8._0_8_ = local_a8 + 0x10;
          std::__cxx11::string::_M_construct((ulong)local_a8,(char)current_indent);
          poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                             (o,(char *)local_a8._0_8_,local_a8._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\"",1);
          escape_string(&local_68,(string_t *)(p_Var3 + 1));
          poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar1,local_68._M_dataplus._M_p,local_68._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\":",2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_40,(ulong)uVar12);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_68._M_dataplus._M_p != &local_68.field_2) {
            operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
          }
          if ((undefined1 *)local_a8._0_8_ != local_a8 + 0x10) {
            operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
          }
          dump((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)(p_Var3 + 2),o,pretty_print,indent_step,current_indent);
          p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
          poVar2 = (this->m_value).object;
        } while ((_Rb_tree_header *)p_Var3 != &(poVar2->_M_t)._M_impl.super__Rb_tree_header);
      }
      if (pretty_print) {
        current_indent = current_indent - indent_step;
        std::__ostream_insert<char,std::char_traits<char>>(o,"\n",1);
      }
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_68,(char)current_indent);
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_68);
      psVar7 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_a8._16_8_ = *psVar7;
        lStack_90 = plVar4[3];
        local_a8._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_a8 + 0x10);
      }
      else {
        local_a8._16_8_ = *psVar7;
        local_a8._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*plVar4;
      }
      local_a8._8_8_ = plVar4[1];
      *plVar4 = (long)psVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__ostream_insert<char,std::char_traits<char>>(o,(char *)local_a8._0_8_,local_a8._8_8_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_a8 + 0x10)) {
        operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
      }
      _Var11._M_p = local_68._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p == &local_68.field_2) {
        return;
      }
      goto LAB_0011840d;
    }
    pcVar10 = "{}";
    goto LAB_0011825b;
  case array:
    if ((((this->m_value).array)->
        super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
        )._M_impl.super__Vector_impl_data._M_start !=
        (((this->m_value).array)->
        super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      std::__ostream_insert<char,std::char_traits<char>>(o,"[",1);
      if (pretty_print) {
        current_indent = current_indent + indent_step;
        std::__ostream_insert<char,std::char_traits<char>>(o,"\n",1);
      }
      paVar6 = (this->m_value).array;
      this_00 = (paVar6->
                super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      cVar9 = (char)current_indent;
      if (this_00 !=
          (paVar6->
          super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
          )._M_impl.super__Vector_impl_data._M_finish) {
        local_40 = ",";
        if (pretty_print) {
          local_40 = ",\n";
        }
        local_48 = (char *)((ulong)uVar12 + 1);
        do {
          if (this_00 !=
              (paVar6->
              super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
              )._M_impl.super__Vector_impl_data._M_start) {
            std::__ostream_insert<char,std::char_traits<char>>(o,local_40,(long)local_48);
          }
          local_a8._0_8_ = local_a8 + 0x10;
          std::__cxx11::string::_M_construct((ulong)local_a8,cVar9);
          std::__ostream_insert<char,std::char_traits<char>>
                    (o,(char *)local_a8._0_8_,local_a8._8_8_);
          if ((undefined1 *)local_a8._0_8_ != local_a8 + 0x10) {
            operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
          }
          dump(this_00,o,pretty_print,indent_step,current_indent);
          this_00 = this_00 + 1;
          paVar6 = (this->m_value).array;
        } while (this_00 !=
                 (paVar6->
                 super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish);
      }
      if (pretty_print) {
        cVar9 = cVar9 - (char)indent_step;
        std::__ostream_insert<char,std::char_traits<char>>(o,"\n",1);
      }
      local_a8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_a8 + 0x10);
      std::__cxx11::string::_M_construct((ulong)local_a8,cVar9);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (o,(char *)local_a8._0_8_,local_a8._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"]",1);
      local_68.field_2._M_allocated_capacity = local_a8._16_8_;
      _Var11._M_p = (pointer)local_a8._0_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._0_8_ ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_a8 + 0x10)) {
        return;
      }
      goto LAB_0011840d;
    }
    pcVar10 = "[]";
LAB_0011825b:
    uVar8 = 2;
    break;
  case string:
    local_a8._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)(local_a8 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"\"","");
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (o,(char *)local_a8._0_8_,local_a8._8_8_);
    escape_string(&local_68,(this->m_value).string);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,local_68._M_dataplus._M_p,local_68._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\"",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    local_68.field_2._M_allocated_capacity = local_a8._16_8_;
    _Var11._M_p = (pointer)local_a8._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_a8 + 0x10)) {
      return;
    }
LAB_0011840d:
    operator_delete(_Var11._M_p,local_68.field_2._M_allocated_capacity + 1);
    return;
  case boolean:
    pcVar10 = "false";
    if ((ulong)(this->m_value).boolean != 0) {
      pcVar10 = "true";
    }
    uVar8 = (ulong)(this->m_value).boolean ^ 5;
    break;
  case number_integer:
    local_88[0x10] = '\0';
    local_88[0x11] = '\0';
    local_88[0x12] = '\0';
    local_88[0x13] = '\0';
    local_88[0x14] = '\0';
    local_88[0x15] = '\0';
    local_88[0x16] = '\0';
    local_88[0x17] = '\0';
    local_88[0x18] = '\0';
    local_88[0x19] = '\0';
    local_88[0x1a] = '\0';
    local_88[0x1b] = '\0';
    local_88[0x1c] = '\0';
    local_88[0x1d] = '\0';
    local_88[0x1e] = '\0';
    local_88[0x1f] = '\0';
    local_88[0] = '\0';
    local_88[1] = '\0';
    local_88[2] = '\0';
    local_88[3] = '\0';
    local_88[4] = '\0';
    local_88[5] = '\0';
    local_88[6] = '\0';
    local_88[7] = '\0';
    local_88[8] = '\0';
    local_88[9] = '\0';
    local_88[10] = '\0';
    local_88[0xb] = '\0';
    local_88[0xc] = '\0';
    local_88[0xd] = '\0';
    local_88[0xe] = '\0';
    local_88[0xf] = '\0';
    local_a8[0x10] = '\0';
    local_a8[0x11] = '\0';
    local_a8[0x12] = '\0';
    local_a8[0x13] = '\0';
    local_a8[0x14] = '\0';
    local_a8[0x15] = '\0';
    local_a8[0x16] = '\0';
    local_a8[0x17] = '\0';
    lStack_90._0_1_ = '\0';
    lStack_90._1_1_ = '\0';
    lStack_90._2_1_ = '\0';
    lStack_90._3_1_ = '\0';
    lStack_90._4_1_ = '\0';
    lStack_90._5_1_ = '\0';
    lStack_90._6_1_ = '\0';
    lStack_90._7_1_ = '\0';
    local_a8[0] = '\0';
    local_a8[1] = '\0';
    local_a8[2] = '\0';
    local_a8[3] = '\0';
    local_a8[4] = '\0';
    local_a8[5] = '\0';
    local_a8[6] = '\0';
    local_a8[7] = '\0';
    local_a8[8] = '\0';
    local_a8[9] = '\0';
    local_a8[10] = '\0';
    local_a8[0xb] = '\0';
    local_a8[0xc] = '\0';
    local_a8[0xd] = '\0';
    local_a8[0xe] = '\0';
    local_a8[0xf] = '\0';
    numtostr::x_write<long>((numtostr *)local_a8,(this->m_value).object);
    goto LAB_00118222;
  case number_unsigned:
    local_88[0x10] = '\0';
    local_88[0x11] = '\0';
    local_88[0x12] = '\0';
    local_88[0x13] = '\0';
    local_88[0x14] = '\0';
    local_88[0x15] = '\0';
    local_88[0x16] = '\0';
    local_88[0x17] = '\0';
    local_88[0x18] = '\0';
    local_88[0x19] = '\0';
    local_88[0x1a] = '\0';
    local_88[0x1b] = '\0';
    local_88[0x1c] = '\0';
    local_88[0x1d] = '\0';
    local_88[0x1e] = '\0';
    local_88[0x1f] = '\0';
    local_88[0] = '\0';
    local_88[1] = '\0';
    local_88[2] = '\0';
    local_88[3] = '\0';
    local_88[4] = '\0';
    local_88[5] = '\0';
    local_88[6] = '\0';
    local_88[7] = '\0';
    local_88[8] = '\0';
    local_88[9] = '\0';
    local_88[10] = '\0';
    local_88[0xb] = '\0';
    local_88[0xc] = '\0';
    local_88[0xd] = '\0';
    local_88[0xe] = '\0';
    local_88[0xf] = '\0';
    local_a8[0x10] = '\0';
    local_a8[0x11] = '\0';
    local_a8[0x12] = '\0';
    local_a8[0x13] = '\0';
    local_a8[0x14] = '\0';
    local_a8[0x15] = '\0';
    local_a8[0x16] = '\0';
    local_a8[0x17] = '\0';
    lStack_90._0_1_ = '\0';
    lStack_90._1_1_ = '\0';
    lStack_90._2_1_ = '\0';
    lStack_90._3_1_ = '\0';
    lStack_90._4_1_ = '\0';
    lStack_90._5_1_ = '\0';
    lStack_90._6_1_ = '\0';
    lStack_90._7_1_ = '\0';
    local_a8[0] = '\0';
    local_a8[1] = '\0';
    local_a8[2] = '\0';
    local_a8[3] = '\0';
    local_a8[4] = '\0';
    local_a8[5] = '\0';
    local_a8[6] = '\0';
    local_a8[7] = '\0';
    local_a8[8] = '\0';
    local_a8[9] = '\0';
    local_a8[10] = '\0';
    local_a8[0xb] = '\0';
    local_a8[0xc] = '\0';
    local_a8[0xd] = '\0';
    local_a8[0xe] = '\0';
    local_a8[0xf] = '\0';
    numtostr::x_write<unsigned_long>((numtostr *)local_a8,(this->m_value).object);
    goto LAB_00118222;
  case number_float:
    local_88[0x10] = '\0';
    local_88[0x11] = '\0';
    local_88[0x12] = '\0';
    local_88[0x13] = '\0';
    local_88[0x14] = '\0';
    local_88[0x15] = '\0';
    local_88[0x16] = '\0';
    local_88[0x17] = '\0';
    local_88[0x18] = '\0';
    local_88[0x19] = '\0';
    local_88[0x1a] = '\0';
    local_88[0x1b] = '\0';
    local_88[0x1c] = '\0';
    local_88[0x1d] = '\0';
    local_88[0x1e] = '\0';
    local_88[0x1f] = '\0';
    local_88[0] = '\0';
    local_88[1] = '\0';
    local_88[2] = '\0';
    local_88[3] = '\0';
    local_88[4] = '\0';
    local_88[5] = '\0';
    local_88[6] = '\0';
    local_88[7] = '\0';
    local_88[8] = '\0';
    local_88[9] = '\0';
    local_88[10] = '\0';
    local_88[0xb] = '\0';
    local_88[0xc] = '\0';
    local_88[0xd] = '\0';
    local_88[0xe] = '\0';
    local_88[0xf] = '\0';
    local_a8[0x10] = '\0';
    local_a8[0x11] = '\0';
    local_a8[0x12] = '\0';
    local_a8[0x13] = '\0';
    local_a8[0x14] = '\0';
    local_a8[0x15] = '\0';
    local_a8[0x16] = '\0';
    local_a8[0x17] = '\0';
    lStack_90._0_1_ = '\0';
    lStack_90._1_1_ = '\0';
    lStack_90._2_1_ = '\0';
    lStack_90._3_1_ = '\0';
    lStack_90._4_1_ = '\0';
    lStack_90._5_1_ = '\0';
    lStack_90._6_1_ = '\0';
    lStack_90._7_1_ = '\0';
    local_a8[0] = '\0';
    local_a8[1] = '\0';
    local_a8[2] = '\0';
    local_a8[3] = '\0';
    local_a8[4] = '\0';
    local_a8[5] = '\0';
    local_a8[6] = '\0';
    local_a8[7] = '\0';
    local_a8[8] = '\0';
    local_a8[9] = '\0';
    local_a8[10] = '\0';
    local_a8[0xb] = '\0';
    local_a8[0xc] = '\0';
    local_a8[0xd] = '\0';
    local_a8[0xe] = '\0';
    local_a8[0xf] = '\0';
    numtostr::x_write<double>((numtostr *)(this->m_value).number_integer,local_a8);
LAB_00118222:
    sVar5 = strlen(local_a8);
    std::__ostream_insert<char,std::char_traits<char>>(o,local_a8,sVar5);
    return;
  case discarded:
    pcVar10 = "<discarded>";
    uVar8 = 0xb;
  }
  std::__ostream_insert<char,std::char_traits<char>>(o,pcVar10,uVar8);
  return;
}

Assistant:

void dump(std::ostream& o,
              const bool pretty_print,
              const unsigned int indent_step,
              const unsigned int current_indent = 0) const
    {
        // variable to hold indentation for recursive calls
        unsigned int new_indent = current_indent;

        switch (m_type)
        {
            case value_t::object:
            {
                if (m_value.object->empty())
                {
                    o << "{}";
                    return;
                }

                o << "{";

                // increase indentation
                if (pretty_print)
                {
                    new_indent += indent_step;
                    o << "\n";
                }

                for (auto i = m_value.object->cbegin(); i != m_value.object->cend(); ++i)
                {
                    if (i != m_value.object->cbegin())
                    {
                        o << (pretty_print ? ",\n" : ",");
                    }
                    o << string_t(new_indent, ' ') << "\""
                      << escape_string(i->first) << "\":"
                      << (pretty_print ? " " : "");
                    i->second.dump(o, pretty_print, indent_step, new_indent);
                }

                // decrease indentation
                if (pretty_print)
                {
                    new_indent -= indent_step;
                    o << "\n";
                }

                o << string_t(new_indent, ' ') + "}";
                return;
            }

            case value_t::array:
            {
                if (m_value.array->empty())
                {
                    o << "[]";
                    return;
                }

                o << "[";

                // increase indentation
                if (pretty_print)
                {
                    new_indent += indent_step;
                    o << "\n";
                }

                for (auto i = m_value.array->cbegin(); i != m_value.array->cend(); ++i)
                {
                    if (i != m_value.array->cbegin())
                    {
                        o << (pretty_print ? ",\n" : ",");
                    }
                    o << string_t(new_indent, ' ');
                    i->dump(o, pretty_print, indent_step, new_indent);
                }

                // decrease indentation
                if (pretty_print)
                {
                    new_indent -= indent_step;
                    o << "\n";
                }

                o << string_t(new_indent, ' ') << "]";
                return;
            }

            case value_t::string:
            {
                o << string_t("\"") << escape_string(*m_value.string) << "\"";
                return;
            }

            case value_t::boolean:
            {
                o << (m_value.boolean ? "true" : "false");
                return;
            }

            case value_t::number_integer:
            {
                o << numtostr(m_value.number_integer).c_str();
                return;
            }

            case value_t::number_unsigned:
            {
                o << numtostr(m_value.number_unsigned).c_str();
                return;
            }

            case value_t::number_float:
            {
                o << numtostr(m_value.number_float).c_str();
                return;
            }

            case value_t::discarded:
            {
                o << "<discarded>";
                return;
            }

            case value_t::null:
            {
                o << "null";
                return;
            }
        }
    }